

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdep.c
# Opt level: O0

int qemu_mprotect__osdep(void *addr,size_t size,int prot)

{
  int iVar1;
  int prot_local;
  size_t size_local;
  void *addr_local;
  
  iVar1 = mprotect(addr,size,prot);
  if (iVar1 == 0) {
    addr_local._4_4_ = 0;
  }
  else {
    addr_local._4_4_ = -1;
  }
  return addr_local._4_4_;
}

Assistant:

static int qemu_mprotect__osdep(void *addr, size_t size, int prot)
{
#ifdef _WIN32
    DWORD old_protect;

    if (!VirtualProtect(addr, size, prot, &old_protect)) {
        // g_autofree gchar *emsg = g_win32_error_message(GetLastError());
        // error_report("%s: VirtualProtect failed: %s", __func__, emsg);
        return -1;
    }
    return 0;
#else
    if (mprotect(addr, size, prot)) {
        // error_report("%s: mprotect failed: %s", __func__, strerror(errno));
        return -1;
    }
    return 0;
#endif
}